

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseKernel.cc
# Opt level: O3

void __thiscall OpenMesh::BaseKernel::hprop_stats(BaseKernel *this,ostream *_ostr)

{
  BaseProperty *pBVar1;
  pointer ppBVar2;
  
  ppBVar2 = (this->hprops_).properties_.
            super__Vector_base<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppBVar2 !=
      (this->hprops_).properties_.
      super__Vector_base<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    do {
      pBVar1 = *ppBVar2;
      if (pBVar1 == (BaseProperty *)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>(_ostr,"[deleted]",9);
        std::__ostream_insert<char,std::char_traits<char>>(_ostr,"\n",1);
      }
      else {
        (*pBVar1->_vptr_BaseProperty[9])(pBVar1,_ostr);
      }
      ppBVar2 = ppBVar2 + 1;
    } while (ppBVar2 !=
             (this->hprops_).properties_.
             super__Vector_base<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void BaseKernel::hprop_stats(std::ostream& _ostr ) const
{
  PropertyContainer::Properties::const_iterator it;
  const PropertyContainer::Properties& hps = hprops_.properties();
  for (it=hps.begin(); it!=hps.end(); ++it)
    *it == NULL ? (void)(_ostr << "[deleted]" << "\n") : (*it)->stats(_ostr);

}